

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O0

void __thiscall
Lib::
Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,Indexing::RetrievalAlgorithms::VarBanksN<0u>>>,Lib::DefaultReset,Lib::DefaultKeepRecycled>
::
Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node*,Kernel::TypedTermList,bool,bool,Kernel::AbstractingUnifier,Kernel::AbstractionOracle,bool>
          (Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
           *this,SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *a,Node *as,
          TypedTermList as_1,bool as_2,bool as_3,AbstractingUnifier *as_4,AbstractionOracle as_5,
          bool as_6)

{
  anon_class_64_8_e3e07548 *in_stack_00000030;
  
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>_*,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_*,_Kernel::TypedTermList,_bool,_bool,_Kernel::AbstractingUnifier,_Kernel::AbstractionOracle,_bool>
  ::anon_class_64_8_e3e07548::operator()(in_stack_00000030);
  return;
}

Assistant:

Recycled(A a, As... as) 
    : _self([&](){ 
        if (mem().isNonEmpty()) {
          auto elem = mem().pop();
          elem->init(std::move(a), std::move(as)...);
          return elem;
        } else {
          return IF_USE_PTRS(std::make_unique<T>, T)(std::move(a), std::move(as)...);
        }
    }())
  { }